

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  bool bVar1;
  CppType CVar2;
  string *this_00;
  LogMessage *pLVar3;
  LogFinisher local_f2;
  byte local_f1;
  LogMessage local_f0;
  LogFinisher local_b2;
  byte local_b1;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  Extension *local_28;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  FieldType type_local;
  ExtensionSet *pEStack_10;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)descriptor;
  descriptor_local._3_1_ = type;
  descriptor_local._4_4_ = number;
  pEStack_10 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,&local_28);
  if (bVar1) {
    local_28->type = descriptor_local._3_1_;
    CVar2 = anon_unknown_0::cpp_type(local_28->type);
    local_61 = 0;
    if (CVar2 != CPPTYPE_STRING) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x18a);
      local_61 = 1;
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(local_75,pLVar3);
    }
    if ((local_61 & 1) != 0) {
      LogMessage::~LogMessage(&local_60);
    }
    local_28->is_repeated = false;
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00);
    (local_28->field_0).string_value = this_00;
  }
  else {
    local_b1 = 0;
    if ((local_28->is_repeated & 1U) != 0) {
      LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x18e);
      local_b1 = 1;
      pLVar3 = LogMessage::operator<<
                         (&local_b0,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                         );
      LogFinisher::operator=(&local_b2,pLVar3);
    }
    if ((local_b1 & 1) != 0) {
      LogMessage::~LogMessage(&local_b0);
    }
    CVar2 = anon_unknown_0::cpp_type(local_28->type);
    local_f1 = 0;
    if (CVar2 != CPPTYPE_STRING) {
      LogMessage::LogMessage
                (&local_f0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x18e);
      local_f1 = 1;
      pLVar3 = LogMessage::operator<<
                         (&local_f0,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_f2,pLVar3);
    }
    if ((local_f1 & 1) != 0) {
      LogMessage::~LogMessage(&local_f0);
    }
  }
  local_28->field_0xa = local_28->field_0xa & 0xf0;
  return (string *)(local_28->field_0).int64_value;
}

Assistant:

string* ExtensionSet::MutableString(int number, FieldType type,
                                    const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = false;
    extension->string_value = new string;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, STRING);
  }
  extension->is_cleared = false;
  return extension->string_value;
}